

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O2

ngx_int_t ngx_http_variable_is_args
                    (ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  
  uVar1 = *(uint *)v;
  *(uint *)v = uVar1 & 0x8fffffff | 0x10000000;
  bVar3 = (r->args).len != 0;
  pcVar2 = "?";
  if (!bVar3) {
    pcVar2 = (char *)0x0;
  }
  *(uint *)v = (uint)bVar3 | uVar1 & 0x80000000 | 0x10000000;
  v->data = (u_char *)pcVar2;
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_variable_is_args(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;

    if (r->args.len == 0) {
        v->len = 0;
        v->data = NULL;
        return NGX_OK;
    }

    v->len = 1;
    v->data = (u_char *) "?";

    return NGX_OK;
}